

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall
Parser::tokenizeFile
          (Parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *data_in,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *data_out)

{
  char cVar1;
  bool bVar2;
  reference pbVar3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  reference pcVar4;
  size_type sVar5;
  byte *pbVar6;
  ulong uVar7;
  reference this_01;
  reference data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *a_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1_1;
  uint a;
  bool isSeperator;
  char *c;
  iterator __end2;
  iterator __begin2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range2;
  int local_b8;
  uint bracketDepth;
  int squareBracketDepth;
  bool isBracketOpen;
  bool isQuotationOpen;
  string lineBuffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *currentLine;
  pointer pbStack_80;
  pointer local_78;
  string local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> line;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *data_out_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *data_in_local;
  Parser *this_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(data_in);
  local_38._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(data_in);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&local_38), bVar2) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_58,(string *)pbVar3);
    fixSpacing(this,(string *)local_58);
    currentLine = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0;
    pbStack_80 = (pointer)0x0;
    local_78 = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&currentLine);
    std::
    vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
    ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                *)data_out,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&currentLine);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&currentLine);
    this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              std::
              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::back(data_out);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&squareBracketDepth,"",(allocator *)((long)&bracketDepth + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&bracketDepth + 3));
    bracketDepth._2_1_ = 0;
    bracketDepth._1_1_ = 0;
    local_b8 = 0;
    __range2._4_4_ = 0;
    __end2._M_current = (char *)std::__cxx11::string::begin();
    c = (char *)std::__cxx11::string::end();
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&c), bVar2) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      bVar2 = false;
      for (__range1_1._0_4_ = 0;
          sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            (&this->seperatorTokens), (uint)__range1_1 < sVar5;
          __range1_1._0_4_ = (uint)__range1_1 + 1) {
        if (*pcVar4 == '\"') {
          bracketDepth._2_1_ = (bracketDepth._2_1_ ^ 0xff) & 1;
          bracketDepth._1_1_ = 1;
        }
        else if (*pcVar4 == '(') {
          __range2._4_4_ = __range2._4_4_ + 1;
          bracketDepth._1_1_ = 1;
        }
        else if (*pcVar4 == ')') {
          __range2._4_4_ = __range2._4_4_ + -1;
          if (__range2._4_4_ == 0) {
            bracketDepth._1_1_ = 0;
          }
        }
        else if (*pcVar4 == '[') {
          local_b8 = local_b8 + 1;
        }
        else if (*pcVar4 == ']') {
          local_b8 = local_b8 + -1;
        }
        if (((((bracketDepth._2_1_ & 1) == 0) &&
             (cVar1 = *pcVar4,
             pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (&this->seperatorTokens,(ulong)(uint)__range1_1),
             (int)cVar1 == (uint)*pbVar6)) && ((bracketDepth._1_1_ & 1) == 0)) && (local_b8 == 0)) {
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &squareBracketDepth);
          }
          std::__cxx11::string::clear();
          bVar2 = true;
          sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            (&this->seperatorTokens);
          __range1_1._0_4_ = (uint)sVar5;
        }
        else if ((((bracketDepth._1_1_ & 1) != 0) && (*pcVar4 == '(')) && (__range2._4_4_ == 1)) {
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &squareBracketDepth);
          }
          std::__cxx11::string::clear();
          sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            (&this->seperatorTokens);
          __range1_1._0_4_ = (uint)sVar5;
        }
      }
      if ((!bVar2) || ((bracketDepth._2_1_ & 1) != 0)) {
        std::__cxx11::string::operator+=((string *)&squareBracketDepth,*pcVar4);
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &squareBracketDepth);
    }
    std::__cxx11::string::~string((string *)&squareBracketDepth);
    std::__cxx11::string::~string(local_58);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin(data_out);
  a_1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)std::
           vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::end(data_out);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                             *)&a_1), bVar2) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::operator*(&__end1_1);
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_01);
    b = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&b), bVar2) {
      data = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2_1);
      processEscapeSequences(this,data);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void Parser::tokenizeFile(const std::vector<std::string>& data_in, std::vector<std::vector<std::string>>& data_out)
{
    for(auto line : data_in) //Iterate through each line
    {
        fixSpacing(line);
        data_out.emplace_back(std::vector<std::string>());
        std::vector<std::string> &currentLine = data_out.back();
        std::string lineBuffer = "";
        bool isQuotationOpen = false;
        bool isBracketOpen = false;
        int squareBracketDepth = 0;
        unsigned int bracketDepth = 0;
        for(const auto &c : line) //Iterate through each character in each line
        {
            bool isSeperator = false;
            for(unsigned int a = 0; a < seperatorTokens.size(); a++) //Check to see if it's a split token
            {
                if(c == '"')
                {
                    isQuotationOpen = !isQuotationOpen;
                    isBracketOpen = true;
                }
                else if(c == '(')
                {
                    bracketDepth++;
                    isBracketOpen = true;
                }
                else if(c == ')')
                {
                    bracketDepth--;
                    if(bracketDepth == 0)
                        isBracketOpen = false;
                }
                else if(c == '[')
                    squareBracketDepth++;
                else if(c == ']')
                    squareBracketDepth--;
                if(!isQuotationOpen && c == seperatorTokens[a] && !isBracketOpen && squareBracketDepth == 0) //If it is, store the buffered word
                {
                    if(!lineBuffer.empty())
                        currentLine.emplace_back(lineBuffer);
                    lineBuffer.clear();
                    isSeperator = true;
                    a = seperatorTokens.size();
                }
                else if(isBracketOpen && c == '(' && bracketDepth == 1)
                {
                    if(!lineBuffer.empty())
                        currentLine.emplace_back(lineBuffer);
                    lineBuffer.clear();
                    a = seperatorTokens.size();
                }
            }
            if(!isSeperator || isQuotationOpen) //If not a separator, add to buffered word
            {
                lineBuffer += c;
            }
        }
        if(!lineBuffer.empty())
            currentLine.emplace_back(lineBuffer);
    }

    //Process escape sequences
    for(auto &a : data_out)
    {
        for(auto &b : a)
        {
            processEscapeSequences(b);
        }
    }
}